

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__hdr_info(stbi__context *s,int *x,int *y,int *comp)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  char buffer [1024];
  char *local_448;
  int *local_440;
  char local_438;
  undefined1 uStack_437;
  char cStack_436;
  undefined4 uStack_435;
  unkbyte9 Stack_431;
  undefined7 uStack_428;
  
  iVar3 = stbi__hdr_test(s);
  if ((iVar3 != 0) && (local_440 = x, stbi__hdr_gettoken(s,&local_438), local_438 != '\0')) {
    bVar2 = false;
    do {
      auVar6[1] = uStack_437;
      auVar6[0] = local_438;
      auVar6[2] = cStack_436;
      auVar6._3_4_ = uStack_435;
      auVar6._7_9_ = Stack_431;
      auVar1._9_7_ = uStack_428;
      auVar1._0_9_ = Stack_431;
      auVar6 = vpternlogq_avx512vl(s_FORMAT_32_bit_rl32_bit_rle_rgbe_0045ad60._0_16_ ^ auVar6,
                                   s_FORMAT_32_bit_rl32_bit_rle_rgbe_0045ad60._16_16_,auVar1,0xf6);
      if (auVar6 == (undefined1  [16])0x0) {
        bVar2 = true;
      }
      stbi__hdr_gettoken(s,&local_438);
    } while (local_438 != '\0');
    if ((bVar2) &&
       (stbi__hdr_gettoken(s,&local_438),
       cStack_436 == ' ' && CONCAT11(uStack_437,local_438) == 0x592d)) {
      local_448 = (char *)&uStack_435;
      lVar4 = strtol(local_448,&local_448,10);
      if (y != (int *)0x0) {
        *y = (int)lVar4;
      }
      local_448 = local_448 + 2;
      do {
        pcVar5 = local_448;
        local_448 = pcVar5 + 1;
      } while (pcVar5[-2] == ' ');
      if (((pcVar5[-2] == '+') && (pcVar5[-1] == 'X')) && (*pcVar5 == ' ')) {
        lVar4 = strtol(local_448,(char **)0x0,10);
        if (local_440 != (int *)0x0) {
          *local_440 = (int)lVar4;
        }
        if (comp == (int *)0x0) {
          return 1;
        }
        *comp = 3;
        return 1;
      }
    }
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return 0;
}

Assistant:

static int stbi__hdr_info(stbi__context *s, int *x, int *y, int *comp)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;
   int dummy;

   if (!x) x = &dummy;
   if (!y) y = &dummy;
   if (!comp) comp = &dummy;

   if (stbi__hdr_test(s) == 0) {
       stbi__rewind( s );
       return 0;
   }

   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid) {
       stbi__rewind( s );
       return 0;
   }
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3)) {
       stbi__rewind( s );
       return 0;
   }
   token += 3;
   *y = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3)) {
       stbi__rewind( s );
       return 0;
   }
   token += 3;
   *x = (int) strtol(token, NULL, 10);
   *comp = 3;
   return 1;
}